

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O0

Qiniu_Error
reinitializeRecorder(Qiniu_Rio_PutExtra *extra,Qiniu_FileInfo *fi,Qiniu_Rio_Recorder *recorder)

{
  Qiniu_Error QVar1;
  Qiniu_Error err;
  Qiniu_Rio_Recorder *recorder_local;
  Qiniu_FileInfo *fi_local;
  Qiniu_Rio_PutExtra *extra_local;
  char *local_10;
  
  (*recorder->recorderMedium->close)(recorder->recorderMedium);
  QVar1 = Qiniu_Utils_New_Medium
                    (extra->recorder,recorder->recorderKey,1,recorder->recorderMedium,fi);
  local_10 = QVar1.message;
  extra_local = (Qiniu_Rio_PutExtra *)(ulong)(uint)QVar1.code;
  if (QVar1.code == 200) {
    recorder->toLoadProgresses = 0;
    extra_local = (Qiniu_Rio_PutExtra *)Qiniu_OK._0_8_;
    local_10 = Qiniu_OK.message;
  }
  QVar1._0_8_ = (ulong)extra_local & 0xffffffff;
  QVar1.message = local_10;
  return QVar1;
}

Assistant:

Qiniu_Error reinitializeRecorder(Qiniu_Rio_PutExtra *extra, Qiniu_FileInfo *fi, Qiniu_Rio_Recorder *recorder)
{
    Qiniu_Error err;
    recorder->recorderMedium->close(recorder->recorderMedium);
    err = Qiniu_Utils_New_Medium(extra->recorder, recorder->recorderKey, 1, recorder->recorderMedium, fi);
    if (err.code != 200)
    {
        return err;
    }
    recorder->toLoadProgresses = Qiniu_False;
    return Qiniu_OK;
}